

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O3

StructType * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::StructType,LLVMBC::LLVMContext&,std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>>
          (LLVMContext *this,LLVMContext *u,
          vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *u_1)

{
  pointer ppTVar1;
  pointer ppTVar2;
  pointer ppTVar3;
  StructType *ptr;
  
  ptr = (StructType *)allocate(this,0x28,8);
  if (ptr != (StructType *)0x0) {
    ppTVar1 = (u_1->
              super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    ppTVar2 = (u_1->
              super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppTVar3 = (u_1->
              super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    (u_1->super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (u_1->super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (u_1->super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (ptr->super_Type).context = u;
    (ptr->super_Type).type_id = StructTyID;
    (ptr->super_Type).address_space = 0;
    (ptr->member_types).
    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start = ppTVar2;
    (ptr->member_types).
    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppTVar3;
    (ptr->member_types).
    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ppTVar1;
    append_typed_destructor<LLVMBC::StructType>(this,ptr);
    return ptr;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}